

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseUnicodeSet
          (CollationRuleParser *this,int32_t i,UnicodeSet *set,UErrorCode *errorCode)

{
  int iVar1;
  int offset;
  UErrorCode *this_00;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t iVar5;
  UnicodeString local_80;
  char16_t local_3a;
  int local_38;
  int iStack_34;
  UChar c;
  int32_t j;
  int32_t level;
  UErrorCode *errorCode_local;
  UnicodeSet *set_local;
  CollationRuleParser *pCStack_18;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  iStack_34 = 0;
  local_38 = i;
  _j = errorCode;
  errorCode_local = (UErrorCode *)set;
  set_local._4_4_ = i;
  pCStack_18 = this;
  do {
    while( true ) {
      iVar1 = local_38;
      iVar4 = UnicodeString::length(this->rules);
      offset = local_38;
      if (iVar1 == iVar4) {
        setParseError(this,"unbalanced UnicodeSet pattern brackets",_j);
        return local_38;
      }
      local_38 = local_38 + 1;
      local_3a = UnicodeString::charAt(this->rules,offset);
      this_00 = errorCode_local;
      if (local_3a != L'[') break;
      iStack_34 = iStack_34 + 1;
    }
  } while ((local_3a != L']') || (iStack_34 = iStack_34 + -1, iStack_34 != 0));
  UnicodeString::tempSubStringBetween(&local_80,this->rules,set_local._4_4_,local_38);
  UnicodeSet::applyPattern((UnicodeSet *)this_00,&local_80,_j);
  UnicodeString::~UnicodeString(&local_80);
  UVar2 = ::U_FAILURE(*_j);
  if (UVar2 == '\0') {
    iVar4 = skipWhiteSpace(this,local_38);
    local_38 = iVar4;
    iVar5 = UnicodeString::length(this->rules);
    if ((iVar4 == iVar5) || (cVar3 = UnicodeString::charAt(this->rules,local_38), cVar3 != L']')) {
      setParseError(this,"missing option-terminating \']\' after UnicodeSet pattern",_j);
      this_local._4_4_ = local_38;
    }
    else {
      this_local._4_4_ = local_38 + 1;
    }
  }
  else {
    *_j = U_ZERO_ERROR;
    setParseError(this,"not a valid UnicodeSet pattern",_j);
    this_local._4_4_ = local_38;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::parseUnicodeSet(int32_t i, UnicodeSet &set, UErrorCode &errorCode) {
    // Collect a UnicodeSet pattern between a balanced pair of [brackets].
    int32_t level = 0;
    int32_t j = i;
    for(;;) {
        if(j == rules->length()) {
            setParseError("unbalanced UnicodeSet pattern brackets", errorCode);
            return j;
        }
        UChar c = rules->charAt(j++);
        if(c == 0x5b) {  // '['
            ++level;
        } else if(c == 0x5d) {  // ']'
            if(--level == 0) { break; }
        }
    }
    set.applyPattern(rules->tempSubStringBetween(i, j), errorCode);
    if(U_FAILURE(errorCode)) {
        errorCode = U_ZERO_ERROR;
        setParseError("not a valid UnicodeSet pattern", errorCode);
        return j;
    }
    j = skipWhiteSpace(j);
    if(j == rules->length() || rules->charAt(j) != 0x5d) {
        setParseError("missing option-terminating ']' after UnicodeSet pattern", errorCode);
        return j;
    }
    return ++j;
}